

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_conv_transpose_1d(ggml_compute_params *params,ggml_tensor *dst)

{
  int iVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  int64_t iVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  int iVar12;
  int iVar13;
  undefined2 *puVar14;
  undefined4 *puVar15;
  size_t sVar16;
  ulong uVar17;
  int iVar18;
  char *pcVar19;
  long lVar20;
  int i00;
  ulong uVar21;
  int iVar22;
  int64_t i01;
  long lVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  undefined8 uVar27;
  undefined2 *puVar28;
  undefined4 *puVar29;
  undefined2 *puVar30;
  undefined4 *puVar31;
  ulong uVar32;
  float *pfVar33;
  undefined1 auVar34 [16];
  long local_c0;
  float *local_b8;
  ulong local_b0;
  ulong local_70;
  float local_58;
  float local_54;
  ggml_tensor *local_50;
  undefined4 *local_48;
  ulong local_40;
  undefined2 *local_38;
  
  pgVar2 = dst->src[0];
  local_50 = dst;
  if (pgVar2->type == GGML_TYPE_F32) {
    pgVar3 = dst->src[1];
    if (pgVar3->type == GGML_TYPE_F32) {
      if (dst->type == GGML_TYPE_F32) {
        if (pgVar2->nb[0] == 4) {
          if (pgVar3->nb[0] == 4) {
            iVar4 = dst->ne[1];
            uVar5 = pgVar2->ne[2];
            local_70 = pgVar2->ne[0];
            uVar17 = pgVar2->ne[1];
            uVar6 = pgVar3->ne[1];
            sVar7 = dst->nb[1];
            iVar22 = params->ith;
            local_b0 = pgVar3->ne[0];
            iVar13 = params->nth;
            lVar23 = uVar5 * local_70;
            if (iVar22 == 0) {
              sVar8 = pgVar3->nb[1];
              sVar9 = pgVar2->nb[2];
              sVar10 = pgVar2->nb[1];
              lVar20 = 0;
              local_40 = lVar23 * uVar17;
              memset(params->wdata,0,params->wsize);
              dst = local_50;
              local_48 = (undefined4 *)params->wdata;
              local_70 = ~((long)local_70 >> 0x3f) & local_70;
              puVar15 = local_48;
              for (uVar21 = 0; uVar21 != (~((long)uVar5 >> 0x3f) & uVar5); uVar21 = uVar21 + 1) {
                puVar29 = puVar15;
                lVar25 = lVar20;
                for (uVar24 = 0; uVar24 != (~((long)uVar17 >> 0x3f) & uVar17); uVar24 = uVar24 + 1)
                {
                  pvVar11 = pgVar2->data;
                  puVar31 = puVar29;
                  for (uVar32 = 0; local_70 != uVar32; uVar32 = uVar32 + 1) {
                    *puVar31 = *(undefined4 *)((long)pvVar11 + uVar32 * 4 + lVar25);
                    puVar31 = puVar31 + uVar5;
                  }
                  puVar29 = puVar29 + lVar23;
                  lVar25 = lVar25 + sVar10;
                }
                lVar20 = lVar20 + sVar9;
                puVar15 = puVar15 + 1;
              }
              lVar25 = (long)(int)local_40;
              lVar20 = 0;
              puVar15 = local_48 + lVar25;
              local_b0 = ~((long)local_b0 >> 0x3f) & local_b0;
              for (uVar17 = 0; uVar17 != (~((long)uVar6 >> 0x3f) & uVar6); uVar17 = uVar17 + 1) {
                pvVar11 = pgVar3->data;
                puVar29 = puVar15;
                for (uVar21 = 0; local_b0 != uVar21; uVar21 = uVar21 + 1) {
                  *puVar29 = *(undefined4 *)((long)pvVar11 + uVar21 * 4 + lVar20);
                  puVar29 = puVar29 + uVar6;
                }
                puVar15 = puVar15 + 1;
                lVar20 = lVar20 + sVar8;
              }
              pvVar11 = local_50->data;
              sVar16 = ggml_nbytes(local_50);
              memset(pvVar11,0,sVar16);
            }
            else {
              lVar25 = (long)(int)(lVar23 * uVar17);
              local_70 = ~((long)local_70 >> 0x3f) & local_70;
              local_b0 = ~((long)local_b0 >> 0x3f) & local_b0;
            }
            ggml_barrier(params->threadpool);
            iVar18 = dst->op_params[0];
            iVar1 = (int)iVar4;
            iVar13 = (iVar1 + -1 + iVar13) / iVar13;
            iVar22 = iVar22 * iVar13;
            iVar13 = iVar13 + iVar22;
            lVar20 = (long)iVar22;
            if (iVar1 <= iVar13) {
              iVar13 = iVar1;
            }
            pvVar11 = params->wdata;
            local_c0 = sVar7 * lVar20;
            local_b8 = (float *)((long)pvVar11 + lVar23 * lVar20 * 4);
            for (; lVar20 < iVar13; lVar20 = lVar20 + 1) {
              lVar26 = (long)local_50->data + local_c0;
              for (uVar17 = 0; uVar17 != local_b0; uVar17 = uVar17 + 1) {
                pfVar33 = local_b8;
                for (uVar21 = 0; local_70 != uVar21; uVar21 = uVar21 + 1) {
                  local_54 = 0.0;
                  ggml_vec_dot_f32((int)uVar5,&local_54,0,
                                   (float *)((long)pvVar11 +
                                            ((long)((uVar6 << 0x20) * uVar17) >> 0x1e) + lVar25 * 4)
                                   ,0,pfVar33,0,1);
                  pfVar33 = pfVar33 + uVar5;
                  *(float *)(lVar26 + uVar21 * 4) = local_54 + *(float *)(lVar26 + uVar21 * 4);
                }
                lVar26 = lVar26 + (long)iVar18 * 4;
              }
              local_c0 = local_c0 + sVar7;
              local_b8 = local_b8 + lVar23;
            }
            return;
          }
          pcVar19 = "nb10 == sizeof(float)";
          uVar27 = 0x15ed;
        }
        else {
          pcVar19 = "nb00 == sizeof(float)";
          uVar27 = 0x15ec;
        }
      }
      else {
        pcVar19 = "dst->type == GGML_TYPE_F32";
        uVar27 = 0x15e3;
      }
    }
    else {
      pcVar19 = "src1->type == GGML_TYPE_F32";
      uVar27 = 0x15e2;
    }
  }
  else {
    if (pgVar2->type != GGML_TYPE_F16) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
                 ,0x1643,"fatal error");
    }
    pgVar3 = dst->src[1];
    if (pgVar3->type == GGML_TYPE_F32) {
      if (dst->type == GGML_TYPE_F32) {
        if (pgVar2->nb[0] == 2) {
          if (pgVar3->nb[0] == 4) {
            iVar4 = dst->ne[1];
            uVar5 = pgVar2->ne[2];
            local_70 = pgVar2->ne[0];
            uVar17 = pgVar2->ne[1];
            uVar6 = pgVar3->ne[1];
            sVar7 = dst->nb[1];
            iVar22 = params->ith;
            local_b0 = pgVar3->ne[0];
            iVar13 = params->nth;
            lVar23 = uVar5 * local_70;
            if (iVar22 == 0) {
              sVar8 = pgVar3->nb[1];
              sVar9 = pgVar2->nb[2];
              sVar10 = pgVar2->nb[1];
              lVar20 = 0;
              local_48 = (undefined4 *)(lVar23 * uVar17);
              local_40 = local_b0;
              memset(params->wdata,0,params->wsize);
              dst = local_50;
              local_38 = (undefined2 *)params->wdata;
              local_70 = ~((long)local_70 >> 0x3f) & local_70;
              puVar14 = local_38;
              for (uVar21 = 0; uVar21 != (~((long)uVar5 >> 0x3f) & uVar5); uVar21 = uVar21 + 1) {
                puVar28 = puVar14;
                lVar25 = lVar20;
                for (uVar24 = 0; uVar24 != (~((long)uVar17 >> 0x3f) & uVar17); uVar24 = uVar24 + 1)
                {
                  pvVar11 = pgVar2->data;
                  puVar30 = puVar28;
                  for (uVar32 = 0; local_70 != uVar32; uVar32 = uVar32 + 1) {
                    *puVar30 = *(undefined2 *)((long)pvVar11 + uVar32 * 2 + lVar25);
                    puVar30 = puVar30 + uVar5;
                  }
                  puVar28 = puVar28 + lVar23;
                  lVar25 = lVar25 + sVar10;
                }
                lVar20 = lVar20 + sVar9;
                puVar14 = puVar14 + 1;
              }
              iVar18 = (int)local_48;
              lVar20 = 0;
              local_b0 = ~((long)local_40 >> 0x3f) & local_40;
              for (uVar17 = 0; uVar17 != (~((long)uVar6 >> 0x3f) & uVar6); uVar17 = uVar17 + 1) {
                uVar21 = 0;
                while (local_b0 != uVar21) {
                  lVar25 = uVar21 * 4;
                  uVar21 = uVar21 + 1;
                  auVar34 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pgVar3->data + lVar25 + lVar20)),
                                           0);
                  vpextrw_avx(auVar34,0);
                }
                lVar20 = lVar20 + sVar8;
              }
              pvVar11 = local_50->data;
              sVar16 = ggml_nbytes(local_50);
              memset(pvVar11,0,sVar16);
            }
            else {
              iVar18 = (int)(undefined4 *)(lVar23 * uVar17);
              local_70 = ~((long)local_70 >> 0x3f) & local_70;
              local_b0 = ~((long)local_b0 >> 0x3f) & local_b0;
            }
            ggml_barrier(params->threadpool);
            iVar1 = dst->op_params[0];
            iVar12 = (int)iVar4;
            iVar13 = (iVar12 + -1 + iVar13) / iVar13;
            iVar22 = iVar22 * iVar13;
            iVar13 = iVar13 + iVar22;
            lVar20 = (long)iVar22;
            if (iVar12 <= iVar13) {
              iVar13 = iVar12;
            }
            pvVar11 = params->wdata;
            local_c0 = sVar7 * lVar20;
            local_b8 = (float *)((long)pvVar11 + lVar23 * lVar20 * 2);
            for (; lVar20 < iVar13; lVar20 = lVar20 + 1) {
              lVar25 = (long)local_50->data + local_c0;
              for (uVar17 = 0; uVar17 != local_b0; uVar17 = uVar17 + 1) {
                pfVar33 = local_b8;
                for (uVar21 = 0; local_70 != uVar21; uVar21 = uVar21 + 1) {
                  local_58 = 0.0;
                  ggml_vec_dot_f16((int)uVar5,&local_58,0,
                                   (ggml_fp16_t *)
                                   ((long)pvVar11 +
                                   ((long)((uVar6 << 0x20) * uVar17) >> 0x1f) + (long)iVar18 * 2),0,
                                   (ggml_fp16_t *)pfVar33,0,1);
                  pfVar33 = (float *)((long)pfVar33 + uVar5 * 2);
                  *(float *)(lVar25 + uVar21 * 4) = local_58 + *(float *)(lVar25 + uVar21 * 4);
                }
                lVar25 = lVar25 + (long)iVar1 * 4;
              }
              local_c0 = local_c0 + sVar7;
              local_b8 = (float *)((long)local_b8 + lVar23 * 2);
            }
            return;
          }
          pcVar19 = "nb10 == sizeof(float)";
          uVar27 = 0x1595;
        }
        else {
          pcVar19 = "nb00 == sizeof(ggml_fp16_t)";
          uVar27 = 0x1594;
        }
      }
      else {
        pcVar19 = "dst->type == GGML_TYPE_F32";
        uVar27 = 0x158b;
      }
    }
    else {
      pcVar19 = "src1->type == GGML_TYPE_F32";
      uVar27 = 0x158a;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar27,"GGML_ASSERT(%s) failed",pcVar19);
}

Assistant:

void ggml_compute_forward_conv_transpose_1d(
        const ggml_compute_params * params,
              ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F16:
            {
                ggml_compute_forward_conv_transpose_1d_f16_f32(params, dst);
            } break;
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_conv_transpose_1d_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}